

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall
QWidgetPrivate::determineLastFocusChild(QWidgetPrivate *this,QWidget *noFurtherThan)

{
  bool bVar1;
  bool bVar2;
  FocusPolicy FVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  const_iterator o;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *focusNext;
  QWidget *w;
  QObject *object;
  add_const_t<const_QList<QObject_*>_> *__range2;
  QWidget *focusProxy;
  QWidget *lastFocusChild;
  QWidget *q;
  const_iterator __end2;
  const_iterator __begin2;
  QObject *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  uint7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  QWidget *local_68;
  QWidget *local_40;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  pQVar5 = deepestFocusProxy((QWidgetPrivate *)
                             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (pQVar5 == (QWidget *)0x0) {
    QObject::children((QObject *)0x384008);
    local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QObject_*>::begin((QList<QObject_*> *)in_stack_ffffffffffffff80);
    o = QList<QObject_*>::end((QList<QObject_*> *)in_stack_ffffffffffffff80);
    while (bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_10,o), local_40 = pQVar4,
          bVar1) {
      QList<QObject_*>::const_iterator::operator*(&local_10);
      local_40 = qobject_cast<QWidget*>(in_stack_ffffffffffffff78);
      if ((local_40 != (QWidget *)0x0) &&
         (pQVar5 = QWidget::focusProxy(in_stack_ffffffffffffff80), pQVar5 == pQVar4)) break;
      QList<QObject_*>::const_iterator::operator++(&local_10);
    }
  }
  else {
    bVar1 = QWidget::isAncestorOf
                      ((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff80);
    local_40 = pQVar4;
    if (bVar1) {
      local_68 = QWidget::nextInFocusChain(in_stack_ffffffffffffff80);
      local_40 = pQVar5;
      while( true ) {
        bVar1 = false;
        if (local_68 != pQVar5) {
          bVar2 = QWidget::isAncestorOf
                            ((QWidget *)(ulong)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          bVar1 = false;
          if (bVar2) {
            in_stack_ffffffffffffff80 = QWidget::window((QWidget *)in_RDI);
            pQVar4 = QWidget::window((QWidget *)in_RDI);
            bVar1 = in_stack_ffffffffffffff80 == pQVar4;
          }
        }
        if ((!bVar1) || (local_68 == in_RSI)) break;
        FVar3 = QWidget::focusPolicy(local_68);
        if (FVar3 != NoFocus) {
          local_40 = local_68;
        }
        local_68 = QWidget::nextInFocusChain(in_stack_ffffffffffffff80);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

QWidget *QWidgetPrivate::determineLastFocusChild(QWidget *noFurtherThan)
{
    Q_Q(QWidget);
    // Since we need to repeat the same logic for both 'first' and 'second', we add a function
    // that determines the last focus child for a widget, taking proxies and compound widgets into
    // account. If the target is not a compound widget (it doesn't have a focus proxy that points
    // to a child), 'lastFocusChild' will be set to the target itself.
    QWidget *lastFocusChild = q;

    QWidget *focusProxy = deepestFocusProxy();
    if (!focusProxy) {
        // QTBUG-81097: Another case is possible here. We can have a child
        // widget, that sets its focusProxy() to the parent (target).
        // An example of such widget is a QLineEdit, nested into
        // a QAbstractSpinBox. In this case such widget should be considered
        // the last focus child.
        for (auto *object : std::as_const(q->children())) {
            QWidget *w = qobject_cast<QWidget *>(object);
            if (w && w->focusProxy() == q) {
                lastFocusChild = w;
                break;
            }
        }
    } else if (q->isAncestorOf(focusProxy)) {
        lastFocusChild = focusProxy;
        for (QWidget *focusNext = lastFocusChild->nextInFocusChain();
             focusNext != focusProxy && q->isAncestorOf(focusNext)
                          && focusNext->window() == focusProxy->window();
             focusNext = focusNext->nextInFocusChain()) {
            if (focusNext == noFurtherThan)
                break;
            if (focusNext->focusPolicy() != Qt::NoFocus)
                lastFocusChild = focusNext;
        }
    }
    return lastFocusChild;
}